

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParseTools.cpp
# Opt level: O1

char * Rml::XMLParseTools::FindTag(char *tag,char *string,bool closing_tag)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  char cVar7;
  char *p_begin;
  byte bVar8;
  StringView local_50;
  StringView local_40;
  byte bVar9;
  
  sVar4 = strlen(tag);
  cVar7 = *string;
  if (cVar7 != '\0') {
    bVar9 = 0;
    bVar8 = 0;
    p_begin = string;
    do {
      iVar3 = tolower((int)cVar7);
      if (iVar3 == *tag) {
        StringView::StringView(&local_40,p_begin,p_begin + sVar4);
        StringView::StringView(&local_50,tag,tag + sVar4);
        bVar2 = StringUtilities::StringCompareCaseInsensitive(local_40,local_50);
        if (bVar2) {
          pbVar5 = (byte *)(p_begin + -1);
          pbVar6 = pbVar5;
          for (; string < pbVar5; pbVar5 = pbVar5 + -1) {
            bVar1 = *pbVar5;
            pbVar6 = pbVar5;
            if ((0x2f < (ulong)bVar1) || ((0x800100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            break;
            if (bVar1 == 0x2f) {
              bVar9 = 1;
            }
            pbVar6 = (byte *)string;
            bVar8 = bVar9;
          }
          if (((bVar8 ^ closing_tag) & 1) == 0 && *pbVar6 == 0x3c) {
            return (char *)pbVar6;
          }
        }
      }
      cVar7 = p_begin[1];
      p_begin = p_begin + 1;
    } while (cVar7 != '\0');
  }
  return (char *)0x0;
}

Assistant:

const char* XMLParseTools::FindTag(const char* tag, const char* string, bool closing_tag)
{
	const size_t length = strlen(tag);
	const char* ptr = string;
	bool found_closing = false;

	while (*ptr)
	{
		// Check if the first character matches
		if (tolower((*ptr)) == tag[0])
		{
			// If it does, check the whole word
			if (StringUtilities::StringCompareCaseInsensitive(StringView(ptr, ptr + length), StringView(tag, tag + length)))
			{
				// Check for opening <, loop back in the string skipping white space and forward slashes if
				// we're looking for the closing tag
				const char* tag_start = ptr - 1;
				while (tag_start > string && (StringUtilities::IsWhitespace(*tag_start) || *tag_start == '/'))
				{
					if (*tag_start == '/')
						found_closing = true;
					tag_start--;
				}

				// If the character we're looking at is a <, and found closing matches closing tag,
				// its the tag we're looking for
				if (*tag_start == '<' && found_closing == closing_tag)
					return tag_start;

				// Otherwise, keep looking
			}
		}
		ptr++;
	}

	return nullptr;
}